

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::SimplePathSuffixSyntax::setChild
          (SimplePathSuffixSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *this_00;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *pSVar1;
  logic_error *this_01;
  string local_f0;
  allocator<char> local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  size_t local_18;
  size_t index_local;
  SimplePathSuffixSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  if (index == 0) {
    this_00 = TokenOrSyntax::node(&child);
    pSVar1 = SyntaxNode::as<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>>(this_00);
    SeparatedSyntaxList<slang::syntax::NameSyntax>::operator=(&this->outputs,pSVar1);
    return;
  }
  this_01 = (logic_error *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
             ,&local_b9);
  std::operator+(&local_98,&local_b8,":");
  std::__cxx11::to_string(&local_f0,0x2e32);
  std::operator+(&local_78,&local_98,&local_f0);
  std::operator+(&local_58,&local_78,": ");
  std::operator+(&local_38,&local_58,"Default case should be unreachable!");
  std::logic_error::logic_error(this_01,(string *)&local_38);
  __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void SimplePathSuffixSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: outputs = child.node()->as<SeparatedSyntaxList<NameSyntax>>(); return;
        default: ASSUME_UNREACHABLE;
    }
}